

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void * op_freopen(OpusFileCallbacks *_cb,char *_path,char *_mode,void *_stream)

{
  FILE *_fp;
  OpusFileCallbacks *pOVar1;
  FILE *fp;
  void *_stream_local;
  char *_mode_local;
  char *_path_local;
  OpusFileCallbacks *_cb_local;
  
  _fp = freopen64(_path,_mode,(FILE *)_stream);
  if (_fp != (FILE *)0x0) {
    pOVar1 = op_get_file_callbacks((FILE *)_fp);
    _cb->read = pOVar1->read;
    _cb->seek = pOVar1->seek;
    _cb->tell = pOVar1->tell;
    _cb->close = pOVar1->close;
  }
  return _fp;
}

Assistant:

void *op_freopen(OpusFileCallbacks *_cb,const char *_path,const char *_mode,
 void *_stream){
  FILE *fp;
#if !defined(_WIN32)
  fp=freopen(_path,_mode,(FILE *)_stream);
#else
  fp=NULL;
  {
    wchar_t *wpath;
    wchar_t *wmode;
    wpath=op_utf8_to_utf16(_path);
    wmode=op_utf8_to_utf16(_mode);
    if(wmode==NULL)errno=EINVAL;
    else if(wpath==NULL)errno=ENOENT;
    else fp=_wfreopen(wpath,wmode,(FILE *)_stream);
    _ogg_free(wmode);
    _ogg_free(wpath);
  }
#endif
  if(fp!=NULL)*_cb=*op_get_file_callbacks(fp);
  return fp;
}